

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoinVerticesProcess.cpp
# Opt level: O1

void __thiscall Assimp::JoinVerticesProcess::Execute(JoinVerticesProcess *this,aiScene *pScene)

{
  bool bVar1;
  int iVar2;
  Logger *pLVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"JoinVerticesProcess begin");
  iVar6 = 0;
  bVar1 = DefaultLogger::isNullLogger();
  iVar5 = 0;
  if ((!bVar1) && ((ulong)pScene->mNumMeshes != 0)) {
    uVar4 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + pScene->mMeshes[uVar4]->mNumVertices;
      uVar4 = uVar4 + 1;
    } while (pScene->mNumMeshes != uVar4);
  }
  if (pScene->mNumMeshes != 0) {
    uVar4 = 0;
    iVar6 = 0;
    do {
      iVar2 = ProcessMesh(this,pScene->mMeshes[uVar4],(uint)uVar4);
      iVar6 = iVar6 + iVar2;
      uVar4 = uVar4 + 1;
    } while (uVar4 < pScene->mNumMeshes);
  }
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    pLVar3 = DefaultLogger::get();
    if (iVar5 - iVar6 == 0) {
      Logger::debug(pLVar3,"JoinVerticesProcess finished ");
    }
    else {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[42]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [42])"JoinVerticesProcess finished | Verts in: ");
      std::ostream::operator<<
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 iVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," out: ",6);
      std::ostream::operator<<(local_1a8,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," | ~",4);
      std::ostream::_M_insert<double>((double)(((float)(iVar5 - iVar6) / (float)iVar5) * 100.0));
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar3,(char *)local_1c8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
  }
  *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 8;
  return;
}

Assistant:

void JoinVerticesProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("JoinVerticesProcess begin");

    // get the total number of vertices BEFORE the step is executed
    int iNumOldVertices = 0;
    if (!DefaultLogger::isNullLogger()) {
        for( unsigned int a = 0; a < pScene->mNumMeshes; a++)   {
            iNumOldVertices +=  pScene->mMeshes[a]->mNumVertices;
        }
    }

    // execute the step
    int iNumVertices = 0;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
        iNumVertices += ProcessMesh( pScene->mMeshes[a],a);

    // if logging is active, print detailed statistics
    if (!DefaultLogger::isNullLogger()) {
        if (iNumOldVertices == iNumVertices) {
            ASSIMP_LOG_DEBUG("JoinVerticesProcess finished ");
        } else {
            ASSIMP_LOG_INFO_F("JoinVerticesProcess finished | Verts in: ", iNumOldVertices,
                " out: ", iNumVertices, " | ~",
                ((iNumOldVertices - iNumVertices) / (float)iNumOldVertices) * 100.f );
        }
    }

    pScene->mFlags |= AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
}